

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_ffh_tonumber(lua_State *L)

{
  byte bVar1;
  int32_t __base;
  int iVar2;
  uint uVar3;
  GCstr *in_RAX;
  TValue *o;
  GCstr *pGVar4;
  ulong uVar5;
  CType *pCVar6;
  CTState *cts;
  undefined1 auVar7 [16];
  GCstr *local_28;
  
  local_28 = in_RAX;
  __base = lj_lib_optint(L,2,10);
  if (__base == 10) {
    o = lj_lib_checkany(L,1);
    uVar3 = (o->field_2).it;
    if (uVar3 < 0xffff0000) {
LAB_0013baf9:
      L->base[-1].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)o;
      return 2;
    }
    if (uVar3 == 0xfffffffb) {
      iVar2 = lj_strscan_num((GCstr *)(ulong)(o->u32).lo,o);
      if (iVar2 != 0) goto LAB_0013baf9;
      uVar3 = (o->field_2).it;
    }
    if (uVar3 == 0xfffffff5) {
      cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
      cts->L = L;
      pCVar6 = lj_ctype_rawref(cts,(uint)*(ushort *)((ulong)(o->u32).lo + 6));
      uVar3 = pCVar6->info;
      if ((uVar3 & 0xf0000000) == 0x50000000) {
        uVar3 = *(uint *)((long)&cts->tab->info + (ulong)((uVar3 & 0xffff) << 4));
      }
      if (uVar3 < 0x10000000 || (uVar3 & 0xf4000000) == 0x34000000) {
        lj_cconv_ct_tv(cts,cts->tab + 0xe,(uint8_t *)&L->base[-1].u64,o,0);
        return 2;
      }
    }
  }
  else {
    pGVar4 = lj_lib_checkstr(L,1);
    if (__base - 0x25U < 0xffffffdd) {
      lj_err_arg(L,2,LJ_ERR_BASERNG);
    }
    uVar5 = strtoul((char *)(pGVar4 + 1),(char **)&local_28,__base);
    if (pGVar4 + 1 != local_28) {
      do {
        bVar1 = (byte)(local_28->nextgc).gcptr32;
        local_28 = (GCstr *)((long)&(local_28->nextgc).gcptr32 + 1);
      } while ((""[(ulong)bVar1 + 1] & 2) != 0);
      if (bVar1 == 0) {
        auVar7._8_4_ = (int)(uVar5 >> 0x20);
        auVar7._0_8_ = uVar5;
        auVar7._12_4_ = 0x45300000;
        L->base[-1].n =
             (auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
        return 2;
      }
    }
  }
  *(undefined4 *)((long)L->base + -4) = 0xffffffff;
  return 2;
}

Assistant:

LJLIB_ASM(tonumber)		LJLIB_REC(.)
{
  int32_t base = lj_lib_optint(L, 2, 10);
  if (base == 10) {
    TValue *o = lj_lib_checkany(L, 1);
    if (lj_strscan_numberobj(o)) {
      copyTV(L, L->base-1, o);
      return FFH_RES(1);
    }
#if LJ_HASFFI
    if (tviscdata(o)) {
      CTState *cts = ctype_cts(L);
      CType *ct = lj_ctype_rawref(cts, cdataV(o)->ctypeid);
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info) || ctype_iscomplex(ct->info)) {
	if (LJ_DUALNUM && ctype_isinteger_or_bool(ct->info) &&
	    ct->size <= 4 && !(ct->size == 4 && (ct->info & CTF_UNSIGNED))) {
	  int32_t i;
	  lj_cconv_ct_tv(cts, ctype_get(cts, CTID_INT32), (uint8_t *)&i, o, 0);
	  setintV(L->base-1, i);
	  return FFH_RES(1);
	}
	lj_cconv_ct_tv(cts, ctype_get(cts, CTID_DOUBLE),
		       (uint8_t *)&(L->base-1)->n, o, 0);
	return FFH_RES(1);
      }
    }
#endif
  } else {
    const char *p = strdata(lj_lib_checkstr(L, 1));
    char *ep;
    unsigned long ul;
    if (base < 2 || base > 36)
      lj_err_arg(L, 2, LJ_ERR_BASERNG);
    ul = strtoul(p, &ep, base);
    if (p != ep) {
      while (lj_char_isspace((unsigned char)(*ep))) ep++;
      if (*ep == '\0') {
	if (LJ_DUALNUM && LJ_LIKELY(ul < 0x80000000u))
	  setintV(L->base-1, (int32_t)ul);
	else
	  setnumV(L->base-1, (lua_Number)ul);
	return FFH_RES(1);
      }
    }
  }
  setnilV(L->base-1);
  return FFH_RES(1);
}